

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::DefinedFunc::DoCall
          (DefinedFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  Store *this_00;
  RunResult RVar1;
  Enum EVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_68;
  RefPtr<wabt::interp::Trap> local_48;
  
  if ((long)(params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
            _M_impl.super__Vector_impl_data._M_start >> 4 ==
      (long)(this->super_Func).type_.params.
            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super_Func).type_.params.
            super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    Thread::PushValues(thread,&(this->super_Func).type_.params,params);
    RVar1 = Thread::PushCall(thread,this,out_trap);
    EVar2 = Error;
    if (RVar1 != Trap) {
      do {
        RVar1 = Thread::Run(thread,1000,out_trap);
      } while (RVar1 == Ok);
      if (RVar1 != Trap) {
        if (RVar1 == Exception) {
          this_00 = thread->store_;
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,"uncaught exception","");
          local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          Store::
          Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
                    (&local_48,this_00,this_00,&local_88,&local_68);
          out_trap->obj_ = local_48.obj_;
          out_trap->store_ = local_48.store_;
          out_trap->root_index_ = local_48.root_index_;
          local_48.root_index_ = 0;
          local_48.obj_ = (Trap *)0x0;
          local_48.store_ = (Store *)0x0;
          if (local_68.super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_68.
                            super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_68.
                                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_68.
                                  super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          Thread::PopValues(thread,&(this->super_Func).type_.results,results);
          EVar2 = Ok;
        }
      }
    }
    return (Result)EVar2;
  }
  __assert_fail("params.size() == type_.params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x1b6,
                "virtual Result wabt::interp::DefinedFunc::DoCall(Thread &, const Values &, Values &, Trap::Ptr *)"
               );
}

Assistant:

Result DefinedFunc::DoCall(Thread& thread,
                           const Values& params,
                           Values& results,
                           Trap::Ptr* out_trap) {
  assert(params.size() == type_.params.size());
  thread.PushValues(type_.params, params);
  RunResult result = thread.PushCall(*this, out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  result = thread.Run(out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  } else if (result == RunResult::Exception) {
    // While this is not actually a trap, it is a convenient way
    // to report an uncaught exception.
    *out_trap = Trap::New(thread.store(), "uncaught exception");
    return Result::Error;
  }
  thread.PopValues(type_.results, &results);
  return Result::Ok;
}